

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall
c4::yml::Tree::lookup_path_or_modify(Tree *this,csubstr default_value,csubstr path,size_t start)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  NodeData *pNVar4;
  csubstr *pcVar5;
  
  sVar3 = _lookup_path_or_create(this,path,start);
  bVar2 = has_parent(this,sVar3);
  if (!bVar2) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        sVar3 = (*pcVar1)();
        return sVar3;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_00231528)
              ("check failed: has_parent(node)",0x1e,(anonymous_namespace)::s_default_callbacks);
  }
  pNVar4 = _p(this,sVar3);
  pNVar4 = _p(this,pNVar4->m_parent);
  if (((pNVar4->m_type).type & MAP) == NOTYPE) {
    to_val(this,sVar3,default_value,0);
  }
  else {
    pcVar5 = key(this,sVar3);
    to_keyval(this,sVar3,*pcVar5,default_value,0);
  }
  return sVar3;
}

Assistant:

size_t Tree::lookup_path_or_modify(csubstr default_value, csubstr path, size_t start)
{
    size_t target = _lookup_path_or_create(path, start);
    if(parent_is_map(target))
        to_keyval(target, key(target), default_value);
    else
        to_val(target, default_value);
    return target;
}